

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O0

void list_insert_ordered(AD *ad,AD **list,_func_Boolean_AD_ptr_AD_ptr *pred)

{
  long lVar1;
  code *in_RDX;
  long *in_RSI;
  long in_RDI;
  AD *ad2;
  AD *ad1;
  long local_28;
  long local_20;
  
  if (*in_RSI == 0) {
    *(undefined8 *)(in_RDI + 0x40) = 0;
    *in_RSI = in_RDI;
  }
  else {
    local_28 = 0;
    for (local_20 = *in_RSI; local_20 != 0; local_20 = *(long *)(local_20 + 0x40)) {
      lVar1 = (*in_RDX)(in_RDI,local_20);
      if (lVar1 != 0) {
        if (local_28 == 0) {
          *in_RSI = in_RDI;
        }
        else {
          *(long *)(local_28 + 0x40) = in_RDI;
        }
        *(long *)(in_RDI + 0x40) = local_20;
        return;
      }
      local_28 = local_20;
    }
    *(long *)(local_28 + 0x40) = in_RDI;
    *(undefined8 *)(in_RDI + 0x40) = 0;
  }
  return;
}

Assistant:

private void list_insert_ordered(ad, list, pred)
    AD        *ad;        /* the AD to insert */
    AD        **list;        /* the list to insert into */
    Boolean    (*pred)(AD *, AD *);    /* predicate */
{
    AD        *ad1;        /* lead traversal pointer */
    AD        *ad2;        /* trailing traversal pointer */

    if (*list == (AD *)NULL)
    {
        /* empty list */
        ad->next = (AD *)NULL;
        *list = ad;
        return;
    }

    /* list has at least one element */
    for (ad2 = (AD *)NULL, ad1 = *list; ad1; ad2 = ad1, ad1 = ad1->next)
    {
        /* does ad1 match? */
        if ((*pred)(ad, ad1))
        {
            /* yes; insert ad before ad1 */
            if (ad2)
            {
                /* ad1 is second or later element */
                ad2->next = ad;
            }
            else
            {
                /* ad1 is first element */
                *list = ad;
            }
            ad->next = ad1;

            /* success */
            return;
        }
    }

    /* append ad to list */
    ad2->next = ad;
    ad->next = (AD *)NULL;
}